

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getFileAux<llvm::WritableMemoryBuffer>
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,
            uint64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  uint uVar1;
  int FD_00;
  int iVar2;
  long *plVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  char *pcVar6;
  uint *puVar7;
  ssize_t sVar8;
  error_category *peVar9;
  file_status *Val;
  ulong uVar10;
  WritableMemoryBuffer *pWVar11;
  long __offset;
  void *__buf;
  error_code EC;
  error_code eVar12;
  error_code eVar13;
  int FD;
  uint64_t local_98;
  WritableMemoryBuffer *local_90;
  undefined1 local_88 [16];
  file_status Status;
  
  eVar12 = llvm::sys::fs::openFileForRead(Filename,&FD,F_None,(SmallVectorImpl<char> *)0x0);
  FD_00 = FD;
  eVar13._M_cat = eVar12._M_cat;
  if (eVar12._M_value != 0) {
    eVar13._4_4_ = 0;
    eVar13._M_value = eVar12._M_value;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,eVar13);
    return __return_storage_ptr__;
  }
  if ((getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
       ::PageSize == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                                   ::PageSize), iVar2 != 0)) {
    getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
    ::PageSize = llvm::sys::Process::getPageSize();
    __cxa_guard_release(&getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                         ::PageSize);
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == -1)) {
    Status.super_basic_file_status.fs_st_size._0_4_ = 0;
    Status.super_basic_file_status.fs_st_size._4_4_ = 0;
    Status.super_basic_file_status.Type = status_error;
    Status.super_basic_file_status.fs_st_atime_nsec = 0;
    Status.super_basic_file_status.fs_st_mtime_nsec = 0;
    Status.super_basic_file_status.fs_st_uid = 0;
    Status.super_basic_file_status.fs_st_gid = 0;
    Status.super_basic_file_status.fs_st_atime = 0;
    Status.super_basic_file_status.fs_st_mtime = 0;
    Status.super_basic_file_status.Perms = perms_not_known;
    Status.fs_st_dev = 0;
    Status.fs_st_nlinks = 0;
    Status.fs_st_ino = 0;
    eVar13 = llvm::sys::fs::status(FD_00,&Status);
    peVar9 = eVar13._M_cat;
    if (eVar13._M_value == 0) {
      if ((Status.super_basic_file_status.Type != regular_file) &&
         (Status.super_basic_file_status.Type != block_file)) {
        getMemoryBufferForStream(__return_storage_ptr__,FD_00,Filename);
        goto LAB_00164823;
      }
      MapSize = CONCAT44(Status.super_basic_file_status.fs_st_size._4_4_,
                         (undefined4)Status.super_basic_file_status.fs_st_size);
      goto LAB_00164630;
    }
    uVar10 = (ulong)(uint)eVar13._M_value;
LAB_0016481e:
    EC._M_cat = peVar9;
    EC._0_8_ = uVar10;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,EC);
  }
  else {
LAB_00164630:
    local_98 = Offset;
    if (((RequiresNullTerminator) || (MapSize < 0x4000)) ||
       (MapSize < getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                  ::PageSize)) {
LAB_00164708:
      llvm::WritableMemoryBuffer::getNewUninitMemBuffer
                ((WritableMemoryBuffer *)&Status,MapSize,Filename);
      if (Status.super_basic_file_status.fs_st_atime == 0) {
        peVar9 = (error_category *)std::_V2::generic_category();
        uVar10 = 0xc;
        goto LAB_0016481e;
      }
      local_90 = (WritableMemoryBuffer *)Status.super_basic_file_status.fs_st_atime;
      __buf = *(void **)(Status.super_basic_file_status.fs_st_atime + 8);
      local_98 = local_98 + MapSize;
      for (; MapSize != 0; MapSize = MapSize - sVar8) {
        __offset = local_98 - MapSize;
        puVar7 = (uint *)__errno_location();
        while( true ) {
          *puVar7 = 0;
          sVar8 = pread(FD_00,__buf,MapSize,__offset);
          if (sVar8 != -1) break;
          uVar1 = *puVar7;
          if (uVar1 != 4) {
            peVar9 = (error_category *)std::_V2::generic_category();
            eVar12._4_4_ = 0;
            eVar12._M_value = uVar1;
            eVar12._M_cat = peVar9;
            llvm::
            ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
            ::ErrorOr(__return_storage_ptr__,eVar12);
            pWVar11 = local_90;
            goto LAB_001647da;
          }
        }
        if (sVar8 == 0) {
          memset(__buf,0,MapSize);
          break;
        }
        __buf = (void *)((long)__buf + sVar8);
      }
      Val = &Status;
    }
    else {
      Status.super_basic_file_status.fs_st_atime =
           Status.super_basic_file_status.fs_st_atime & 0xffffffff00000000;
      Status.super_basic_file_status.fs_st_mtime = std::_V2::system_category();
      local_88._8_8_ = Filename;
      plVar3 = (long *)operator_new(0x30,(NamedBufferAlloc *)(local_88 + 8));
      *plVar3 = (long)&PTR__MemoryBufferMMapFile_001f4e70;
      uVar4 = anon_unknown.dwarf_25e44e::MemoryBufferMMapFile<llvm::WritableMemoryBuffer>::
              getLegalMapOffset(Offset);
      uVar5 = anon_unknown.dwarf_25e44e::MemoryBufferMMapFile<llvm::WritableMemoryBuffer>::
              getLegalMapOffset(Offset);
      llvm::sys::fs::mapped_file_region::mapped_file_region
                ((mapped_file_region *)(plVar3 + 3),FD_00,priv,(Offset + MapSize) - uVar4,uVar5,
                 (error_code *)&Status);
      if ((int)Status.super_basic_file_status.fs_st_atime != 0) {
LAB_001646ff:
        (**(code **)(*plVar3 + 8))(plVar3);
        goto LAB_00164708;
      }
      pcVar6 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar3 + 3));
      uVar4 = local_98;
      uVar5 = anon_unknown.dwarf_25e44e::MemoryBufferMMapFile<llvm::WritableMemoryBuffer>::
              getLegalMapOffset(local_98);
      plVar3[1] = (long)(pcVar6 + (uVar4 - uVar5));
      plVar3[2] = (long)(pcVar6 + (uVar4 - uVar5) + MapSize);
      local_88._0_8_ = plVar3;
      if ((int)Status.super_basic_file_status.fs_st_atime != 0) goto LAB_001646ff;
      Val = (file_status *)local_88;
    }
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
    ::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                *)__return_storage_ptr__,
               (unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                *)Val,(type *)0x0);
    pWVar11 = (((__uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                 *)&(Val->super_basic_file_status).fs_st_atime)->_M_t).
              super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
              .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl;
LAB_001647da:
    if (pWVar11 != (WritableMemoryBuffer *)0x0) {
      (*(pWVar11->super_MemoryBuffer)._vptr_MemoryBuffer[1])();
    }
  }
LAB_00164823:
  close(FD);
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}